

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5TokendataIterDelete(Fts5TokenDataIter *pSet)

{
  long lVar1;
  
  if (pSet != (Fts5TokenDataIter *)0x0) {
    if (0 < pSet->nIter) {
      lVar1 = 0;
      do {
        fts5MultiIterFree(pSet->apIter[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < pSet->nIter);
    }
    sqlite3_free((pSet->terms).p);
    (pSet->terms).p = (u8 *)0x0;
    (pSet->terms).n = 0;
    (pSet->terms).nSpace = 0;
    sqlite3_free(pSet->aPoslistReader);
    sqlite3_free(pSet->aMap);
    sqlite3_free(pSet);
    return;
  }
  return;
}

Assistant:

static void fts5TokendataIterDelete(Fts5TokenDataIter *pSet){
  if( pSet ){
    int ii;
    for(ii=0; ii<pSet->nIter; ii++){
      fts5MultiIterFree(pSet->apIter[ii]);
    }
    fts5BufferFree(&pSet->terms);
    sqlite3_free(pSet->aPoslistReader);
    sqlite3_free(pSet->aMap);
    sqlite3_free(pSet);
  }
}